

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O3

void __thiscall QStatusBarPrivate::tryToShowSizeGrip(QStatusBarPrivate *this)

{
  QWidget *this_00;
  long in_FS_OFFSET;
  void *local_28;
  char *pcStack_20;
  QMetaTypeInterface *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->showSizeGrip == true) {
    this->showSizeGrip = false;
    this_00 = &this->resizer->super_QWidget;
    if ((this_00 != (QWidget *)0x0) && ((this_00->data->widget_attributes & 0x8000) == 0)) {
      QWidget::setAttribute(this_00,WA_WState_ExplicitShowHide,false);
      local_28 = (void *)0x0;
      pcStack_20 = (char *)0x0;
      local_18 = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl
                ((QObject *)this->resizer,"_q_showIfNotHidden",DirectConnection,1,&local_28,
                 &pcStack_20,&local_18);
      QWidget::setAttribute(&this->resizer->super_QWidget,WA_WState_ExplicitShowHide,false);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tryToShowSizeGrip()
    {
        if (!showSizeGrip)
            return;
        showSizeGrip = false;
        if (!resizer || resizer->isVisible())
            return;
        resizer->setAttribute(Qt::WA_WState_ExplicitShowHide, false);
        QMetaObject::invokeMethod(resizer, "_q_showIfNotHidden", Qt::DirectConnection);
        resizer->setAttribute(Qt::WA_WState_ExplicitShowHide, false);
    }